

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::Output(Node *this,ostream *os)

{
  undefined8 uVar1;
  ostream *poVar2;
  undefined1 local_38 [40];
  ostream *os_local;
  Node *this_local;
  
  local_38._32_8_ = os;
  os_local = (ostream *)this;
  if (NeedIostreamH != 0) {
    poVar2 = std::operator<<(os,"#include <iostream>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <limits>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <array>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedIostreamH = 0;
  }
  poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <cstdlib>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <cstring>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  NeedStdlibH = 0;
  poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <unistd.h>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  NeedUnistd = 0;
  if (NeedMathH != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <cmath>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedMathH = 0;
  }
  if (NeedErrorH != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <cerrno>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedErrorH = 0;
  }
  if (NeedTimeH != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include <ctime>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedTimeH = 0;
  }
  poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include \"basicfun.h\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include \"basicchannel.h\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  NeedChannel = 0;
  NeedBasicFun = 0;
  if (NeedDataList != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include \"datalist.h\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedDataList = 0;
  }
  if (NeedPuse != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include \"pusing.h\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (NeedVirtual != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"#include \"virtual.h\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedVirtual = 0;
  }
  std::ostream::operator<<((void *)local_38._32_8_,std::endl<char,std::char_traits<char>>);
  if (NeedRFA != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,"typedef char RmsRfa[6];");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedRFA = 0;
  }
  if (NeedPuse != 0) {
    poVar2 = std::operator<<((ostream *)local_38._32_8_,
                             "static basic::PUsing PUse;\t// Needed for print using");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    NeedPuse = 0;
  }
  uVar1 = local_38._32_8_;
  Indent_abi_cxx11_((Node *)local_38);
  poVar2 = std::operator<<((ostream *)uVar1,(string *)local_38);
  poVar2 = std::operator<<(poVar2,"extern basic::BasicError Be;");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_38);
  std::ostream::operator<<((void *)local_38._32_8_,std::endl<char,std::char_traits<char>>);
  VariableList::OutputDef(Variables,(ostream *)local_38._32_8_,Level);
  OutputPrototypes(this,(ostream *)local_38._32_8_);
  Level = 0;
  OutputCode(this,(ostream *)local_38._32_8_);
  return;
}

Assistant:

void Node::Output(
	std::ostream& os	/**< Stream to write C++ code to */
)
{
	//
	// Handle Include Files
	//
	if (NeedIostreamH != 0)
	{
		os << "#include <iostream>" << std::endl;
		os << "#include <limits>" << std::endl;
		os << "#include <array>" << std::endl;
		NeedIostreamH = 0;
	}

	os << "#include <cstdlib>" << std::endl;
	os << "#include <cstring>" << std::endl;
	NeedStdlibH = 0;

	os << "#include <unistd.h>" << std::endl;
	NeedUnistd = 0;

	if (NeedMathH != 0)
	{
		os << "#include <cmath>" << std::endl;
		NeedMathH = 0;
	}

	if (NeedErrorH != 0)
	{
		os << "#include <cerrno>" << std::endl;
		NeedErrorH = 0;
	}

	if (NeedTimeH != 0)
	{
		os << "#include <ctime>" << std::endl;
		NeedTimeH = 0;
	}

	os << "#include \"basicfun.h\"" << std::endl;
	os << "#include \"basicchannel.h\"" << std::endl;

	NeedChannel = 0;
	NeedBasicFun = 0;

	if (NeedDataList != 0)
	{
		os << "#include \"datalist.h\"" << std::endl;
		NeedDataList = 0;
	}

	if (NeedPuse != 0)
	{
		os << "#include \"pusing.h\"" << std::endl;
	}

	if (NeedVirtual != 0)
	{
		os << "#include \"virtual.h\"" << std::endl;
		NeedVirtual = 0;
	}

	os << std::endl;

	if (NeedRFA != 0)
	{
		os << "typedef char RmsRfa[6];" << std::endl;
		NeedRFA = 0;
	}

	if (NeedPuse != 0)
	{
		os << "static basic::PUsing PUse;\t// Needed for print using" << std::endl;
		NeedPuse = 0;
	}

	//
	// This code duplicates basicfun.h, but sometimes it is still needed
	// 
	os << Indent() << "extern basic::BasicError Be;" <<
		std::endl;

	os << std::endl;

	//
	// Output the variables
	//
	Variables->OutputDef(os, Level);

	//
	// Dump out prototypes
	//
	OutputPrototypes(os);

	//
	// Output code
	//
	Level = 0;
	OutputCode(os);
}